

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

TRef find_kinit(jit_State *J,BCIns *endpc,BCReg slot,IRType t)

{
  GCproto *pGVar1;
  uint uVar2;
  uint uVar3;
  uint64_t uVar4;
  byte bVar6;
  int k;
  TRef TVar5;
  long lVar7;
  ulong uVar8;
  GCproto *pGVar9;
  GCproto *pGVar10;
  double dVar11;
  
  pGVar1 = J->pt + 1;
  pGVar10 = (GCproto *)endpc;
  do {
    while( true ) {
      pGVar9 = pGVar10;
      pGVar10 = (GCproto *)((long)&pGVar9[-1].varinfo.ptr64 + 4);
      if (pGVar10 <= pGVar1) {
        return 0;
      }
      uVar2 = (uint)(pGVar10->nextgc).gcptr64;
      bVar6 = (byte)(uVar2 >> 8);
      if ((lj_bc_mode[(byte)uVar2] & 7) == 1) break;
      if (((lj_bc_mode[(byte)uVar2] & 7) == 2) && (bVar6 <= slot)) {
        return 0;
      }
    }
  } while (bVar6 != slot);
  if (1 < (uVar2 & 0xff) - 0x29) {
    return 0;
  }
  for (lVar7 = -4; pGVar10 = (GCproto *)((long)&(pGVar9->nextgc).gcptr64 + lVar7), pGVar1 < pGVar10;
      lVar7 = lVar7 + -4) {
    uVar3 = (uint)(pGVar10->nextgc).gcptr64;
    if (((char)uVar3 == 'X') &&
       (uVar8 = (ulong)(uVar3 >> 0xe & 0x3fffc),
       (BCIns *)((long)pGVar9 + lVar7 + uVar8 + -0x1fffc) <= endpc &&
       -8 < (long)(uVar8 + lVar7 + -0x20000))) {
      return 0;
    }
  }
  if ((uVar2 & 0xff) == 0x29) {
    k = (int)uVar2 >> 0x10;
    if (t == IRT_INT) {
LAB_0014d673:
      TVar5 = lj_ir_kint(J,k);
      return TVar5;
    }
    dVar11 = (double)k;
  }
  else {
    uVar4 = (J->pt->k).ptr64;
    if (t == IRT_INT) {
      dVar11 = *(double *)(uVar4 + (ulong)(uVar2 >> 0x10) * 8);
      if (dVar11 != (double)(int)dVar11) {
        return 0;
      }
      if (NAN(dVar11) || NAN((double)(int)dVar11)) {
        return 0;
      }
      k = (int)dVar11;
      goto LAB_0014d673;
    }
    dVar11 = *(double *)(uVar4 + (ulong)(uVar2 >> 0x10) * 8);
  }
  TVar5 = lj_ir_knum_u64(J,(uint64_t)dVar11);
  return TVar5;
}

Assistant:

static TRef find_kinit(jit_State *J, const BCIns *endpc, BCReg slot, IRType t)
{
  /* This algorithm is rather simplistic and assumes quite a bit about
  ** how the bytecode is generated. It works fine for FORI initializers,
  ** but it won't necessarily work in other cases (e.g. iterator arguments).
  ** It doesn't do anything fancy, either (like backpropagating MOVs).
  */
  const BCIns *pc, *startpc = proto_bc(J->pt);
  for (pc = endpc-1; pc > startpc; pc--) {
    BCIns ins = *pc;
    BCOp op = bc_op(ins);
    /* First try to find the last instruction that stores to this slot. */
    if (bcmode_a(op) == BCMbase && bc_a(ins) <= slot) {
      return 0;  /* Multiple results, e.g. from a CALL or KNIL. */
    } else if (bcmode_a(op) == BCMdst && bc_a(ins) == slot) {
      if (op == BC_KSHORT || op == BC_KNUM) {  /* Found const. initializer. */
	/* Now try to verify there's no forward jump across it. */
	const BCIns *kpc = pc;
	for (; pc > startpc; pc--)
	  if (bc_op(*pc) == BC_JMP) {
	    const BCIns *target = pc+bc_j(*pc)+1;
	    if (target > kpc && target <= endpc)
	      return 0;  /* Conditional assignment. */
	  }
	if (op == BC_KSHORT) {
	  int32_t k = (int32_t)(int16_t)bc_d(ins);
	  return t == IRT_INT ? lj_ir_kint(J, k) : lj_ir_knum(J, (lua_Number)k);
	} else {
	  cTValue *tv = proto_knumtv(J->pt, bc_d(ins));
	  if (t == IRT_INT) {
	    int32_t k = numberVint(tv);
	    if (tvisint(tv) || numV(tv) == (lua_Number)k)  /* -0 is ok here. */
	      return lj_ir_kint(J, k);
	    return 0;  /* Type mismatch. */
	  } else {
	    return lj_ir_knum(J, numberVnum(tv));
	  }
	}
      }
      return 0;  /* Non-constant initializer. */
    }
  }
  return 0;  /* No assignment to this slot found? */
}